

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O3

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::QuadMv<4>_>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::QuadMv<4>_> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  uint uVar9;
  FastAllocator *this_00;
  ThreadLocal *pTVar10;
  ThreadLocal2 *this_01;
  iterator __position;
  QuadMesh *pQVar11;
  BuildPrim *pBVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  size_t sVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vuint4 vprimID;
  vuint4 vgeomID;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  CreateMortonLeaf<4,_embree::QuadMv<4>_> *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  uint local_58 [10];
  
  uVar7 = current->_begin;
  uVar8 = current->_end;
  this_00 = alloc->alloc;
  pTVar10 = alloc->talloc1;
  local_c8 = 0xe0;
  this_01 = pTVar10->parent;
  local_90 = this;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    uStack_f0 = CONCAT71(uStack_f0._1_7_,1);
    local_f8 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_128 = &FastAllocator::s_thread_local_allocators_lock;
    uStack_120 = CONCAT71(uStack_120._1_7_,1);
    local_88 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,(ThreadLocal2 **)&local_88);
    }
    else {
      *__position._M_current = this_01;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if ((char)uStack_f0 == '\x01') {
      MutexSys::unlock(&local_f8->mutex);
    }
  }
  uVar16 = local_c8;
  pTVar10->bytesUsed = pTVar10->bytesUsed + local_c8;
  sVar19 = pTVar10->cur;
  uVar20 = (ulong)(-(int)sVar19 & 0xf);
  uVar17 = sVar19 + local_c8 + uVar20;
  pTVar10->cur = uVar17;
  if (pTVar10->end < uVar17) {
    pTVar10->cur = sVar19;
    uVar17 = pTVar10->allocBlockSize;
    if (local_c8 * 4 < uVar17 || local_c8 * 4 - uVar17 == 0) {
      local_128 = (undefined8 *)uVar17;
      pcVar18 = (char *)FastAllocator::malloc(this_00,(size_t)&local_128);
      pTVar10->ptr = pcVar18;
      sVar19 = (pTVar10->end - pTVar10->cur) + pTVar10->bytesWasted;
      pTVar10->bytesWasted = sVar19;
      pTVar10->end = (size_t)local_128;
      pTVar10->cur = uVar16;
      if (local_128 < uVar16) {
        pTVar10->cur = 0;
        local_128 = (undefined8 *)pTVar10->allocBlockSize;
        pcVar18 = (char *)FastAllocator::malloc(this_00,(size_t)&local_128);
        pTVar10->ptr = pcVar18;
        sVar19 = (pTVar10->end - pTVar10->cur) + pTVar10->bytesWasted;
        pTVar10->bytesWasted = sVar19;
        pTVar10->end = (size_t)local_128;
        pTVar10->cur = uVar16;
        if (local_128 < uVar16) {
          pTVar10->cur = 0;
          pcVar18 = (char *)0x0;
          goto LAB_00be7f5e;
        }
      }
      pTVar10->bytesWasted = sVar19;
    }
    else {
      pcVar18 = (char *)FastAllocator::malloc(this_00,(size_t)&local_c8);
    }
  }
  else {
    pTVar10->bytesWasted = pTVar10->bytesWasted + uVar20;
    pcVar18 = pTVar10->ptr + (uVar17 - local_c8);
  }
LAB_00be7f5e:
  local_58[4] = 0xffffffff;
  local_58[5] = 0xffffffff;
  local_58[6] = 0xffffffff;
  local_58[7] = 0xffffffff;
  local_58[0] = 0xffffffff;
  local_58[1] = 0xffffffff;
  local_58[2] = 0xffffffff;
  local_58[3] = 0xffffffff;
  local_a8._0_4_ = 0;
  local_a8._4_4_ = 0;
  uStack_a0._0_4_ = 0;
  uStack_a0._4_4_ = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = (undefined8 *)0x0;
  uStack_120 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = (ThreadLocal2 *)0x0;
  uStack_f0 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = (ThreadLocal2 *)0x0;
  uStack_80 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  if (uVar8 == uVar7) {
    auVar25 = DAT_01f7a9f0._0_12_;
    local_58[7] = 0xffffffff;
    local_58[4] = 0xffffffff;
    local_58[5] = 0xffffffff;
    local_58[6] = 0xffffffff;
    local_b8._0_4_ = 0;
    local_b8._4_4_ = 0;
    uStack_b0._0_4_ = 0;
    uStack_b0._4_4_ = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    uStack_60._0_4_ = 0;
    uStack_60._4_4_ = 0;
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    uStack_70._0_4_ = 0;
    uStack_70._4_4_ = 0;
    local_88._0_4_ = 0;
    local_88._4_4_ = 0;
    uStack_80._0_4_ = 0;
    uStack_80._4_4_ = 0;
    local_d8._0_4_ = 0;
    local_d8._4_4_ = 0;
    uStack_d0._0_4_ = 0;
    uStack_d0._4_4_ = 0;
    local_e8._0_4_ = 0;
    local_e8._4_4_ = 0;
    uStack_e0._0_4_ = 0;
    uStack_e0._4_4_ = 0;
    local_f8._0_4_ = 0;
    local_f8._4_4_ = 0;
    uStack_f0._0_4_ = 0;
    uStack_f0._4_4_ = 0;
    local_108._0_4_ = 0;
    local_108._4_4_ = 0;
    uStack_100._0_4_ = 0;
    uStack_100._4_4_ = 0;
    local_118._0_4_ = 0;
    local_118._4_4_ = 0;
    uStack_110._0_4_ = 0;
    uStack_110._4_4_ = 0;
    local_128._0_4_ = 0;
    local_128._4_4_ = 0;
    uStack_120._0_4_ = 0;
    uStack_120._4_4_ = 0;
    aVar24 = _DAT_01f7aa00;
    local_58[0] = 0xffffffff;
    local_58[1] = 0xffffffff;
    local_58[2] = 0xffffffff;
    local_58[3] = 0xffffffff;
  }
  else {
    iVar22 = uVar8 - uVar7;
    pQVar11 = local_90->mesh;
    pBVar12 = local_90->morton;
    lVar13 = *(long *)&(pQVar11->super_Geometry).field_0x58;
    lVar14 = *(long *)&pQVar11->field_0x68;
    pcVar15 = (pQVar11->vertices0).super_RawBufferView.ptr_ofs;
    sVar19 = (pQVar11->vertices0).super_RawBufferView.stride;
    uVar8 = local_90->geomID_;
    lVar23 = 0;
    aVar24 = _DAT_01f7aa00;
    auVar26 = _DAT_01f7a9f0;
    do {
      uVar9 = *(uint *)((long)&pBVar12[uVar7].field_0 + lVar23 * 2 + 4);
      lVar21 = (ulong)uVar9 * lVar14;
      auVar3 = *(undefined1 (*) [16])(pcVar15 + *(uint *)(lVar13 + lVar21) * sVar19);
      auVar4 = *(undefined1 (*) [16])(pcVar15 + *(uint *)(lVar13 + 4 + lVar21) * sVar19);
      auVar5 = *(undefined1 (*) [16])(pcVar15 + *(uint *)(lVar13 + 8 + lVar21) * sVar19);
      auVar6 = *(undefined1 (*) [16])(pcVar15 + *(uint *)(lVar13 + 0xc + lVar21) * sVar19);
      auVar26 = minps(auVar26,auVar3);
      auVar28 = minps(auVar4,auVar5);
      auVar26 = minps(auVar26,auVar28);
      auVar26 = minps(auVar26,auVar6);
      auVar25 = auVar26._0_12_;
      auVar28 = maxps((undefined1  [16])aVar24,auVar3);
      auVar29 = maxps(auVar4,auVar5);
      auVar28 = maxps(auVar28,auVar29);
      aVar24 = (anon_union_16_2_47237d3f_for_Vec3fx_0)maxps(auVar28,auVar6);
      *(uint *)((long)local_58 + lVar23 + 0x10) = uVar8;
      *(uint *)((long)local_58 + lVar23) = uVar9;
      *(int *)((long)&local_128 + lVar23) = auVar3._0_4_;
      *(int *)((long)&local_118 + lVar23) = auVar3._4_4_;
      *(int *)((long)&local_108 + lVar23) = auVar3._8_4_;
      *(int *)((long)&local_f8 + lVar23) = auVar4._0_4_;
      *(int *)((long)&local_e8 + lVar23) = auVar4._4_4_;
      *(int *)((long)&local_d8 + lVar23) = auVar4._8_4_;
      *(int *)((long)&local_88 + lVar23) = auVar5._0_4_;
      *(int *)((long)&local_78 + lVar23) = auVar5._4_4_;
      *(int *)((long)&local_68 + lVar23) = auVar5._8_4_;
      *(int *)((long)&local_c8 + lVar23) = auVar6._0_4_;
      *(int *)((long)&local_b8 + lVar23) = auVar6._4_4_;
      *(int *)((long)&local_a8 + lVar23) = auVar6._8_4_;
      lVar23 = lVar23 + 4;
    } while ((ulong)(iVar22 + (uint)(iVar22 == 0)) << 2 != lVar23);
  }
  *(undefined4 *)pcVar18 = (undefined4)local_128;
  *(undefined4 *)(pcVar18 + 4) = local_128._4_4_;
  *(undefined4 *)(pcVar18 + 8) = (undefined4)uStack_120;
  *(undefined4 *)(pcVar18 + 0xc) = uStack_120._4_4_;
  *(undefined4 *)(pcVar18 + 0x10) = (undefined4)local_118;
  *(undefined4 *)(pcVar18 + 0x14) = local_118._4_4_;
  *(undefined4 *)(pcVar18 + 0x18) = (undefined4)uStack_110;
  *(undefined4 *)(pcVar18 + 0x1c) = uStack_110._4_4_;
  *(undefined4 *)(pcVar18 + 0x20) = (undefined4)local_108;
  *(undefined4 *)(pcVar18 + 0x24) = local_108._4_4_;
  *(undefined4 *)(pcVar18 + 0x28) = (undefined4)uStack_100;
  *(undefined4 *)(pcVar18 + 0x2c) = uStack_100._4_4_;
  *(undefined4 *)(pcVar18 + 0x30) = (undefined4)local_f8;
  *(undefined4 *)(pcVar18 + 0x34) = local_f8._4_4_;
  *(undefined4 *)(pcVar18 + 0x38) = (undefined4)uStack_f0;
  *(undefined4 *)(pcVar18 + 0x3c) = uStack_f0._4_4_;
  *(undefined4 *)(pcVar18 + 0x40) = (undefined4)local_e8;
  *(undefined4 *)(pcVar18 + 0x44) = local_e8._4_4_;
  *(undefined4 *)(pcVar18 + 0x48) = (undefined4)uStack_e0;
  *(undefined4 *)(pcVar18 + 0x4c) = uStack_e0._4_4_;
  *(undefined4 *)(pcVar18 + 0x50) = (undefined4)local_d8;
  *(undefined4 *)(pcVar18 + 0x54) = local_d8._4_4_;
  *(undefined4 *)(pcVar18 + 0x58) = (undefined4)uStack_d0;
  *(undefined4 *)(pcVar18 + 0x5c) = uStack_d0._4_4_;
  *(undefined4 *)(pcVar18 + 0x60) = (undefined4)local_88;
  *(undefined4 *)(pcVar18 + 100) = local_88._4_4_;
  *(undefined4 *)(pcVar18 + 0x68) = (undefined4)uStack_80;
  *(undefined4 *)(pcVar18 + 0x6c) = uStack_80._4_4_;
  *(undefined4 *)(pcVar18 + 0x70) = (undefined4)local_78;
  *(undefined4 *)(pcVar18 + 0x74) = local_78._4_4_;
  *(undefined4 *)(pcVar18 + 0x78) = (undefined4)uStack_70;
  *(undefined4 *)(pcVar18 + 0x7c) = uStack_70._4_4_;
  *(undefined4 *)(pcVar18 + 0x80) = (undefined4)local_68;
  *(undefined4 *)(pcVar18 + 0x84) = local_68._4_4_;
  *(undefined4 *)(pcVar18 + 0x88) = (undefined4)uStack_60;
  *(undefined4 *)(pcVar18 + 0x8c) = uStack_60._4_4_;
  *(ulong *)(pcVar18 + 0x90) = local_c8;
  *(undefined8 *)(pcVar18 + 0x98) = uStack_c0;
  *(undefined4 *)(pcVar18 + 0xa0) = (undefined4)local_b8;
  *(undefined4 *)(pcVar18 + 0xa4) = local_b8._4_4_;
  *(undefined4 *)(pcVar18 + 0xa8) = (undefined4)uStack_b0;
  *(undefined4 *)(pcVar18 + 0xac) = uStack_b0._4_4_;
  *(undefined4 *)(pcVar18 + 0xb0) = (undefined4)local_a8;
  *(undefined4 *)(pcVar18 + 0xb4) = local_a8._4_4_;
  *(undefined4 *)(pcVar18 + 0xb8) = (undefined4)uStack_a0;
  *(undefined4 *)(pcVar18 + 0xbc) = uStack_a0._4_4_;
  *(uint *)(pcVar18 + 0xc0) = local_58[4];
  *(uint *)(pcVar18 + 0xc4) = local_58[5];
  *(uint *)(pcVar18 + 200) = local_58[6];
  *(uint *)(pcVar18 + 0xcc) = local_58[7];
  *(uint *)(pcVar18 + 0xd0) = local_58[0];
  *(uint *)(pcVar18 + 0xd4) = local_58[1];
  *(uint *)(pcVar18 + 0xd8) = local_58[2];
  *(uint *)(pcVar18 + 0xdc) = local_58[3];
  aVar27.m128[3] = (float)(current->_end - current->_begin);
  aVar27._0_12_ = auVar25;
  (__return_storage_ptr__->ref).ptr = (ulong)pcVar18 | 9;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar27;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar24;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items<=4);
        
        /* allocate leaf node */
        Quad4v* accel = (Quad4v*) alloc.malloc1(sizeof(Quad4v),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,1);
        
        vuint4 vgeomID = -1, vprimID = -1;
        Vec3vf4 v0 = zero, v1 = zero, v2 = zero, v3 = zero;
        const QuadMesh* __restrict__ mesh = this->mesh;

        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          const QuadMesh::Quad& tri = mesh->quad(primID);
          const Vec3fa& p0 = mesh->vertex(tri.v[0]);
          const Vec3fa& p1 = mesh->vertex(tri.v[1]);
          const Vec3fa& p2 = mesh->vertex(tri.v[2]);
          const Vec3fa& p3 = mesh->vertex(tri.v[3]);
          lower = min(lower,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2,(vfloat4)p3);
          upper = max(upper,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2,(vfloat4)p3);
          vgeomID [i] = geomID_;
          vprimID [i] = primID;
          v0.x[i] = p0.x; v0.y[i] = p0.y; v0.z[i] = p0.z;
          v1.x[i] = p1.x; v1.y[i] = p1.y; v1.z[i] = p1.z;
          v2.x[i] = p2.x; v2.y[i] = p2.y; v2.z[i] = p2.z;
          v3.x[i] = p3.x; v3.y[i] = p3.y; v3.z[i] = p3.z;
        }
        Quad4v::store_nt(accel,Quad4v(v0,v1,v2,v3,vgeomID,vprimID));
        BBox3fx box_o = BBox3fx((Vec3fx)lower,(Vec3fx)upper);
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }